

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.hh
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::Node::AddChildren(Node *this,string *child_name,size_t node_index)

{
  size_type sVar1;
  size_t local_28;
  size_t node_index_local;
  string *child_name_local;
  Node *this_local;
  
  local_28 = node_index;
  node_index_local = (size_t)child_name;
  child_name_local = (string *)this;
  sVar1 = ::std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->_primChildren,child_name);
  if (sVar1 == 0) {
    ::std::
    unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::emplace<std::__cxx11::string_const&>
              ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->_primChildren,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_index_local
              );
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->_children,&local_28);
  }
  return sVar1 == 0;
}

Assistant:

bool AddChildren(const std::string &child_name, size_t node_index) {
      if (_primChildren.count(child_name)) {
        return false;
      }
      // assert(_primChildren.count(child_name) == 0);
      _primChildren.emplace(child_name);
      _children.push_back(node_index);
      return true;
    }